

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall embree::ISPCScene::~ISPCScene(ISPCScene *this)

{
  size_t i;
  ulong uVar1;
  
  alignedUSMFree(this->geometries);
  alignedUSMFree(this->materials);
  for (uVar1 = 0; uVar1 < this->numLights; uVar1 = uVar1 + 1) {
    Light_destroy(this->lights[uVar1]);
  }
  alignedUSMFree(this->lights);
  return;
}

Assistant:

ISPCScene::~ISPCScene()
  {
    alignedUSMFree(geometries);
    alignedUSMFree(materials);

    for (size_t i=0; i<numLights; i++)
      Light_destroy(lights[i]);
    alignedUSMFree(lights);
  }